

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSearchPath.cxx
# Opt level: O0

void __thiscall
cmSearchPath::AddPrefixPaths
          (cmSearchPath *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *paths,char *base)

{
  cmMakefile *this_00;
  bool bVar1;
  uint uVar2;
  reference pbVar3;
  reference pcVar4;
  char *pcVar5;
  ulong uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  undefined1 local_140 [8];
  string add;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  allocator local_b9;
  string local_b8;
  char *local_98;
  char *arch;
  undefined1 local_88 [8];
  string dir;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  const_iterator p;
  allocator local_41;
  undefined1 local_40 [8];
  string subdir;
  char *base_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *paths_local;
  cmSearchPath *this_local;
  
  subdir.field_2._8_8_ = base;
  if (this->FC != (cmFindCommon *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_40,"bin",&local_41);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    bVar1 = std::operator==(&this->FC->CMakePathName,"INCLUDE");
    if (bVar1) {
      std::__cxx11::string::operator=((string *)local_40,"include");
    }
    else {
      bVar1 = std::operator==(&this->FC->CMakePathName,"LIBRARY");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_40,"lib");
      }
      else {
        bVar1 = std::operator==(&this->FC->CMakePathName,"FRAMEWORK");
        if (bVar1) {
          std::__cxx11::string::operator=((string *)local_40,"");
        }
      }
    }
    local_60._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(paths);
    while( true ) {
      dir.field_2._8_8_ =
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(paths);
      bVar1 = __gnu_cxx::operator!=
                        (&local_60,
                         (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&dir.field_2 + 8));
      if (!bVar1) break;
      pbVar3 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_60);
      std::__cxx11::string::string((string *)local_88,(string *)pbVar3);
      uVar2 = std::__cxx11::string::empty();
      bVar1 = false;
      if ((uVar2 & 1) == 0) {
        uVar2 = std::__cxx11::string::empty();
        bVar1 = false;
        if ((uVar2 & 1) == 0) {
          std::__cxx11::string::rbegin();
          pcVar4 = std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&arch);
          bVar1 = *pcVar4 != '/';
        }
      }
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_88,"/");
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"include");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40,"lib"), bVar1)) {
        this_00 = (this->FC->super_cmCommand).Makefile;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_b8,"CMAKE_LIBRARY_ARCHITECTURE",&local_b9);
        pcVar5 = cmMakefile::GetDefinition(this_00,&local_b8);
        std::__cxx11::string::~string((string *)&local_b8);
        std::allocator<char>::~allocator((allocator<char> *)&local_b9);
        local_98 = pcVar5;
        if ((pcVar5 != (char *)0x0) && (*pcVar5 != '\0')) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&add.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_88,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_40);
          std::operator+(&local_100,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&add.field_2 + 8),"/");
          std::operator+(&local_e0,&local_100,local_98);
          AddPathInternal(this,&local_e0,(char *)subdir.field_2._8_8_);
          std::__cxx11::string::~string((string *)&local_e0);
          std::__cxx11::string::~string((string *)&local_100);
          std::__cxx11::string::~string((string *)(add.field_2._M_local_buf + 8));
        }
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_140,"/");
      if (bVar1) {
        AddPathInternal(this,(string *)local_140,(char *)subdir.field_2._8_8_);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_40,"bin");
      if (bVar1) {
        std::operator+(&local_160,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                       ,"sbin");
        AddPathInternal(this,&local_160,(char *)subdir.field_2._8_8_);
        std::__cxx11::string::~string((string *)&local_160);
      }
      uVar6 = std::__cxx11::string::empty();
      if ((uVar6 & 1) == 0) {
        pbVar3 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_60);
        bVar1 = std::operator!=(pbVar3,"/");
        if (bVar1) {
          pbVar3 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_60);
          AddPathInternal(this,pbVar3,(char *)subdir.field_2._8_8_);
        }
      }
      std::__cxx11::string::~string((string *)local_140);
      std::__cxx11::string::~string((string *)local_88);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_60);
    }
    std::__cxx11::string::~string((string *)local_40);
    return;
  }
  __assert_fail("this->FC != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/cmSearchPath.cxx"
                ,0xce,
                "void cmSearchPath::AddPrefixPaths(const std::vector<std::string> &, const char *)")
  ;
}

Assistant:

void cmSearchPath::AddPrefixPaths(const std::vector<std::string>& paths,
                                  const char *base)
{
  assert(this->FC != NULL);

  // default for programs
  std::string subdir = "bin";

  if (this->FC->CMakePathName == "INCLUDE")
    {
    subdir = "include";
    }
  else if (this->FC->CMakePathName == "LIBRARY")
    {
    subdir = "lib";
    }
  else if (this->FC->CMakePathName == "FRAMEWORK")
    {
    subdir = "";  // ? what to do for frameworks ?
    }

  for(std::vector<std::string>::const_iterator p = paths.begin();
      p != paths.end(); ++p)
    {
    std::string dir = *p;
    if(!subdir.empty() && !dir.empty() && *dir.rbegin() != '/')
      {
      dir += "/";
      }
    if(subdir == "include" || subdir == "lib")
      {
      const char* arch =
        this->FC->Makefile->GetDefinition("CMAKE_LIBRARY_ARCHITECTURE");
      if(arch && *arch)
        {
        this->AddPathInternal(dir+subdir+"/"+arch, base);
        }
      }
    std::string add = dir + subdir;
    if(add != "/")
      {
      this->AddPathInternal(add, base);
      }
    if (subdir == "bin")
      {
      this->AddPathInternal(dir+"sbin", base);
      }
    if(!subdir.empty() && *p != "/")
      {
      this->AddPathInternal(*p, base);
      }
    }
}